

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O3

void see_wsegs(monst *worm)

{
  ulong uVar1;
  wseg *pwVar2;
  
  uVar1 = (ulong)worm->wormno;
  if (uVar1 == 0) {
    warning("see_wsegs: worm->wormno was 0");
    return;
  }
  pwVar2 = level->wtails[uVar1];
  if (pwVar2 != level->wheads[uVar1]) {
    do {
      newsym((int)pwVar2->wx,(int)pwVar2->wy);
      pwVar2 = pwVar2->nseg;
    } while (pwVar2 != level->wheads[worm->wormno]);
  }
  return;
}

Assistant:

void see_wsegs(struct monst *worm)
{
    struct wseg *curr = level->wtails[worm->wormno];

    if (!worm->wormno) {
	warning("see_wsegs: worm->wormno was 0");
	return;
    }

    while (curr != level->wheads[worm->wormno]) {
	newsym(curr->wx,curr->wy);
	curr = curr->nseg;
    }
}